

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SentenceFinderAdd(Fts5SFinder *p,int iAdd)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar1 = p->nFirstAlloc;
  if (iVar1 == p->nFirst) {
    iVar3 = 0x40;
    if (iVar1 != 0) {
      iVar3 = iVar1 * 2;
    }
    piVar2 = p->aFirst;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      piVar2 = (int *)sqlite3Realloc(piVar2,(long)iVar3 << 2);
    }
    else {
      piVar2 = (int *)0x0;
    }
    if (piVar2 == (int *)0x0) {
      return 7;
    }
    p->aFirst = piVar2;
    p->nFirstAlloc = iVar3;
  }
  iVar1 = p->nFirst;
  p->nFirst = iVar1 + 1;
  p->aFirst[iVar1] = iAdd;
  return 0;
}

Assistant:

static int fts5SentenceFinderAdd(Fts5SFinder *p, int iAdd){
  if( p->nFirstAlloc==p->nFirst ){
    int nNew = p->nFirstAlloc ? p->nFirstAlloc*2 : 64;
    int *aNew;

    aNew = (int*)sqlite3_realloc64(p->aFirst, nNew*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    p->aFirst = aNew;
    p->nFirstAlloc = nNew;
  }
  p->aFirst[p->nFirst++] = iAdd;
  return SQLITE_OK;
}